

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O1

void xb_cgemm(char *transa,char *transb,int *M,int *N,int *K,void *alpha,void *a,int *p_lda,void *b,
             int *p_ldb,void *beta,void *c,int *p_ldc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  long local_70;
  long local_68;
  long local_58;
  long local_50;
  
  iVar1 = *M;
  iVar2 = *N;
  iVar4 = *K;
  if (iVar1 <= *p_ldc && (0 < iVar4 && (0 < iVar2 && 0 < iVar1))) {
    iVar3 = *p_lda;
    iVar6 = *p_ldb;
    iVar11 = iVar4;
    if ((byte)(*transa | 0x20U) == 0x6e) {
      iVar11 = iVar1;
    }
    if (iVar11 <= iVar3) {
      iVar11 = iVar2;
      if ((byte)(*transb | 0x20U) == 0x6e) {
        iVar11 = iVar4;
      }
      if (iVar11 <= iVar6) {
        fVar15 = *alpha;
        if (((((fVar15 != 0.0) || (NAN(fVar15))) || (*(float *)((long)alpha + 4) != 0.0)) ||
            ((NAN(*(float *)((long)alpha + 4)) || (*beta != 1.0)))) ||
           ((NAN(*beta) ||
            ((*(float *)((long)beta + 4) != 0.0 || (NAN(*(float *)((long)beta + 4)))))))) {
          if ((byte)(*transa | 0x20U) == 0x6e) {
            lVar10 = (long)iVar3 * 2;
            local_68 = 2;
          }
          else {
            local_68 = (long)(iVar3 * 2);
            lVar10 = 2;
          }
          if ((byte)(*transb | 0x20U) == 0x6e) {
            local_70 = (long)iVar6 * 2;
            lVar13 = 2;
          }
          else {
            lVar13 = (long)(iVar6 * 2);
            local_70 = 2;
          }
          iVar3 = *p_ldc * 2;
          if ((((fVar15 != 0.0) || (NAN(fVar15))) || (*(float *)((long)alpha + 4) != 0.0)) ||
             (NAN(*(float *)((long)alpha + 4)))) {
            if (((fVar15 != 1.0) || (NAN(fVar15))) ||
               ((*(float *)((long)alpha + 4) != 0.0 || (NAN(*(float *)((long)alpha + 4)))))) {
              if (0 < iVar1) {
                pfVar5 = (float *)((long)a + 4);
                local_50 = 0;
                iVar6 = 0;
                do {
                  if (0 < iVar2) {
                    iVar11 = 0;
                    lVar14 = local_50;
                    pfVar9 = (float *)((long)b + 4);
                    do {
                      if (iVar4 < 1) {
                        fVar15 = 0.0;
                        fVar16 = 0.0;
                      }
                      else {
                        fVar15 = 0.0;
                        fVar16 = 0.0;
                        pfVar8 = pfVar5;
                        pfVar12 = pfVar9;
                        iVar7 = iVar4;
                        do {
                          fVar17 = *pfVar8;
                          if ((byte)(*transa | 0x20U) == 99) {
                            fVar17 = -fVar17;
                          }
                          fVar18 = *pfVar12;
                          if ((byte)(*transb | 0x20U) == 99) {
                            fVar18 = -fVar18;
                          }
                          fVar15 = fVar15 + pfVar12[-1] * pfVar8[-1] + -fVar17 * fVar18;
                          fVar16 = fVar16 + fVar18 * pfVar8[-1] + fVar17 * pfVar12[-1];
                          pfVar12 = pfVar12 + lVar13;
                          pfVar8 = pfVar8 + lVar10;
                          iVar7 = iVar7 + -1;
                        } while (iVar7 != 0);
                      }
                      fVar17 = *(float *)((long)c + lVar14 * 4);
                      fVar18 = *(float *)((long)c + lVar14 * 4 + 4);
                      fVar20 = (float)*alpha;
                      fVar21 = (float)((ulong)*alpha >> 0x20);
                      fVar19 = (float)*beta;
                      fVar22 = (float)((ulong)*beta >> 0x20);
                      *(ulong *)((long)c + lVar14 * 4) =
                           CONCAT44(fVar17 * fVar22 + fVar19 * fVar18 +
                                    fVar15 * fVar21 + fVar20 * fVar16,
                                    fVar17 * fVar19 + fVar22 * -fVar18 +
                                    fVar15 * fVar20 + fVar21 * -fVar16);
                      iVar11 = iVar11 + 1;
                      lVar14 = lVar14 + iVar3;
                      pfVar9 = pfVar9 + local_70;
                    } while (iVar11 != iVar2);
                  }
                  iVar6 = iVar6 + 1;
                  local_50 = local_50 + 2;
                  pfVar5 = pfVar5 + local_68;
                } while (iVar6 != iVar1);
              }
            }
            else if (((*beta != 0.0) || (NAN(*beta))) ||
                    ((*(float *)((long)beta + 4) != 0.0 || (NAN(*(float *)((long)beta + 4)))))) {
              if (0 < iVar1) {
                pfVar5 = (float *)((long)a + 4);
                local_50 = 0;
                iVar6 = 0;
                do {
                  if (0 < iVar2) {
                    iVar11 = 0;
                    pfVar9 = (float *)((long)b + 4);
                    lVar14 = local_50;
                    do {
                      if (iVar4 < 1) {
                        fVar15 = 0.0;
                        fVar16 = 0.0;
                      }
                      else {
                        fVar15 = 0.0;
                        fVar16 = 0.0;
                        pfVar8 = pfVar9;
                        pfVar12 = pfVar5;
                        iVar7 = iVar4;
                        do {
                          fVar17 = *pfVar12;
                          if ((byte)(*transa | 0x20U) == 99) {
                            fVar17 = -fVar17;
                          }
                          fVar18 = *pfVar8;
                          if ((byte)(*transb | 0x20U) == 99) {
                            fVar18 = -fVar18;
                          }
                          fVar15 = fVar15 + pfVar8[-1] * pfVar12[-1] + -fVar17 * fVar18;
                          fVar16 = fVar16 + fVar18 * pfVar12[-1] + fVar17 * pfVar8[-1];
                          pfVar8 = pfVar8 + lVar13;
                          pfVar12 = pfVar12 + lVar10;
                          iVar7 = iVar7 + -1;
                        } while (iVar7 != 0);
                      }
                      fVar17 = *(float *)((long)c + lVar14 * 4);
                      fVar18 = *(float *)((long)c + lVar14 * 4 + 4);
                      fVar20 = (float)*beta;
                      fVar19 = (float)((ulong)*beta >> 0x20);
                      *(ulong *)((long)c + lVar14 * 4) =
                           CONCAT44(fVar17 * fVar19 + fVar20 * fVar18 + fVar16,
                                    fVar17 * fVar20 + fVar19 * -fVar18 + fVar15);
                      iVar11 = iVar11 + 1;
                      lVar14 = lVar14 + iVar3;
                      pfVar9 = pfVar9 + local_70;
                    } while (iVar11 != iVar2);
                  }
                  iVar6 = iVar6 + 1;
                  local_50 = local_50 + 2;
                  pfVar5 = pfVar5 + local_68;
                } while (iVar6 != iVar1);
              }
            }
            else if (0 < iVar1) {
              pfVar5 = (float *)((long)a + 4);
              local_58 = 0;
              iVar6 = 0;
              do {
                if (0 < iVar2) {
                  iVar11 = 0;
                  pfVar9 = (float *)((long)b + 4);
                  lVar14 = local_58;
                  do {
                    if (iVar4 < 1) {
                      fVar15 = 0.0;
                      fVar16 = 0.0;
                    }
                    else {
                      fVar15 = 0.0;
                      fVar16 = 0.0;
                      pfVar8 = pfVar9;
                      pfVar12 = pfVar5;
                      iVar7 = iVar4;
                      do {
                        fVar17 = *pfVar12;
                        if ((byte)(*transa | 0x20U) == 99) {
                          fVar17 = -fVar17;
                        }
                        fVar18 = *pfVar8;
                        if ((byte)(*transb | 0x20U) == 99) {
                          fVar18 = -fVar18;
                        }
                        fVar15 = fVar15 + pfVar8[-1] * pfVar12[-1] + -fVar17 * fVar18;
                        fVar16 = fVar16 + fVar18 * pfVar12[-1] + fVar17 * pfVar8[-1];
                        pfVar8 = pfVar8 + lVar13;
                        pfVar12 = pfVar12 + lVar10;
                        iVar7 = iVar7 + -1;
                      } while (iVar7 != 0);
                    }
                    *(ulong *)((long)c + lVar14 * 4) = CONCAT44(fVar16,fVar15);
                    iVar11 = iVar11 + 1;
                    lVar14 = lVar14 + iVar3;
                    pfVar9 = pfVar9 + local_70;
                  } while (iVar11 != iVar2);
                }
                iVar6 = iVar6 + 1;
                local_58 = local_58 + 2;
                pfVar5 = pfVar5 + local_68;
              } while (iVar6 != iVar1);
            }
          }
          else if (0 < iVar1) {
            iVar4 = 0;
            do {
              pfVar5 = (float *)c;
              iVar6 = iVar2;
              if (0 < iVar2) {
                do {
                  fVar15 = (float)*beta;
                  fVar16 = (float)((ulong)*beta >> 0x20);
                  *(ulong *)pfVar5 =
                       CONCAT44(*pfVar5 * fVar16 + fVar15 * pfVar5[1],
                                *pfVar5 * fVar15 + fVar16 * -pfVar5[1]);
                  iVar6 = iVar6 + -1;
                  pfVar5 = pfVar5 + iVar3;
                } while (iVar6 != 0);
              }
              iVar4 = iVar4 + 1;
              c = (void *)((long)c + 8);
            } while (iVar4 != iVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_cgemm (char * transa, char *transb, int *M, int *N, int *K,
	  const void *alpha, const void *a, int *p_lda, const void *b, 
	  int *p_ldb, const void *beta, void *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) const void*
 *
 * a       (input) const void*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const void*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) const void*
 *
 * c       (input/output) void*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const float *a_i = (float *) a;
    const float *b_i = (float *) b;

    /* Output Matrix */
    float *c_i = (float *) c;

    /* Input Scalars */
    float *alpha_i = (float *) alpha;
    float *beta_i = (float *) beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    float a_elem[2];
    float b_elem[2];
    float c_elem[2];
    float prod[2];
    float sum[2];
    float tmp1[2];
    float tmp2[2];

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    printf("In Zgemm\n");
#endif

    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0
	&& (beta_i[0] == 1.0 && beta_i[1] == 0.0))
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */
    incci *= 2;
    inccij *= 2;
    incai *= 2;
    incaih *= 2;
    incbj *= 2;
    incbhj *= 2;

    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp1[0] =
			(float) c_elem[0] * beta_i[0] -
			(float) c_elem[1] * beta_i[1];
		    tmp1[1] =
			(float) c_elem[0] * beta_i[1] +
			(float) c_elem[1] * beta_i[0];
		}
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }
    else if ((alpha_i[0] == 1.0 && alpha_i[1] == 0.0))
    {

	/* Case alpha == 1. */

	if (beta_i[0] == 0.0 && beta_i[1] == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			  a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			
			{
			    prod[0] =
				(float) a_elem[0] * b_elem[0] -
				(float) a_elem[1] * b_elem[1];
			    prod[1] =
				(float) a_elem[0] * b_elem[1] +
				(float) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			    a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			{
			    prod[0] =
				(float) a_elem[0] * b_elem[0] -
				(float) a_elem[1] * b_elem[1];
			    prod[1] =
				(float) a_elem[0] * b_elem[1] +
				(float) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }

		    c_elem[0] = c_i[cij];
		    c_elem[1] = c_i[cij + 1];
		    {
			tmp2[0] =
			    (float) c_elem[0] * beta_i[0] -
			    (float) c_elem[1] * beta_i[1];
			tmp2[1] =
			    (float) c_elem[0] * beta_i[1] +
			    (float) c_elem[1] * beta_i[0];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    tmp1[0] = tmp2[0] + tmp1[0];
		    tmp1[1] = tmp2[1] + tmp1[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum[0] = sum[1] = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem[0] = a_i[aih];
		    a_elem[1] = a_i[aih + 1];
		    b_elem[0] = b_i[bhj];
		    b_elem[1] = b_i[bhj + 1];
		    if (*transa == 'c' || *transa == 'C')
		    {
			a_elem[1] = -a_elem[1];
		    }
		    if (*transb == 'c' || *transb == 'C')
		    {
			b_elem[1] = -b_elem[1];
		    }
		    {
			prod[0] =
			    (float) a_elem[0] * b_elem[0] -
			    (float) a_elem[1] * b_elem[1];
			prod[1] =
			    (float) a_elem[0] * b_elem[1] +
			    (float) a_elem[1] * b_elem[0];
		    }
		    sum[0] = sum[0] + prod[0];
		    sum[1] = sum[1] + prod[1];
		}

		{
		    tmp1[0] =
			(float) sum[0] * alpha_i[0] -
			(float) sum[1] * alpha_i[1];
		    tmp1[1] =
			(float) sum[0] * alpha_i[1] +
			(float) sum[1] * alpha_i[0];
		}
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp2[0] =
			(float) c_elem[0] * beta_i[0] -
			(float) c_elem[1] * beta_i[1];
		    tmp2[1] =
			(float) c_elem[0] * beta_i[1] +
			(float) c_elem[1] * beta_i[0];
		}
		tmp1[0] = tmp1[0] + tmp2[0];
		tmp1[1] = tmp1[1] + tmp2[1];
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }



}